

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Company.cpp
# Opt level: O0

void __thiscall Company::payForService(Company *this)

{
  Employee *this_00;
  undefined4 uVar1;
  bool bVar2;
  int iVar3;
  Address local_98;
  undefined1 local_38 [44];
  int i;
  Company *this_local;
  
  unique0x10000109 = this;
  for (local_38._36_4_ = 0; uVar1 = local_38._36_4_, iVar3 = Boss::getNumberOfEmployees(this->boss),
      (int)uVar1 < iVar3; local_38._36_4_ = local_38._36_4_ + 1) {
    Person::getAddress(&local_98,&this->employees[(int)local_38._36_4_]->super_Person);
    Address::getCity_abi_cxx11_((Address *)local_38);
    bVar2 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_38,"Tehran");
    std::__cxx11::string::~string((string *)local_38);
    Address::~Address(&local_98);
    if (bVar2) {
      this_00 = this->employees[(int)local_38._36_4_];
      iVar3 = Employee::getHourWork(this->employees[(int)local_38._36_4_]);
      Employee::setHourWork(this_00,iVar3 + 7);
    }
  }
  return;
}

Assistant:

void Company::payForService() {
    for (int i = 0; i < boss->getNumberOfEmployees(); ++i) {
        if (employees[i]->getAddress().getCity() != "Tehran"){
            employees[i]->setHourWork(employees[i]->getHourWork()+7);
        }
    }
}